

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_p.h
# Opt level: O0

void __thiscall QShortcutPrivate::~QShortcutPrivate(QShortcutPrivate *this)

{
  QObjectPrivate *in_RDI;
  
  *(code **)in_RDI = QHoverEvent::QHoverEvent;
  QList<int>::~QList((QList<int> *)0x4bfc21);
  QString::~QString((QString *)0x4bfc32);
  QList<QKeySequence>::~QList((QList<QKeySequence> *)0x4bfc40);
  QObjectPrivate::~QObjectPrivate(in_RDI);
  return;
}

Assistant:

class Q_GUI_EXPORT QShortcutPrivate : public QObjectPrivate
{
    Q_DECLARE_PUBLIC(QShortcut)
public:
    QShortcutPrivate() = default;

    virtual QShortcutMap::ContextMatcher contextMatcher() const;
    virtual bool handleWhatsThis() { return false; }

    static bool simpleContextMatcher(QObject *object, Qt::ShortcutContext context);

    QList<QKeySequence> sc_sequences;
    QString sc_whatsthis;
    Qt::ShortcutContext sc_context = Qt::WindowShortcut;
    bool sc_enabled = true;
    bool sc_autorepeat = true;
    QList<int> sc_ids;
    void redoGrab(QShortcutMap &map);
}